

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O2

void __thiscall
SListBase<ThunkBlock,_Memory::ArenaAllocator,_RealCount>::MoveHeadTo
          (SListBase<ThunkBlock,_Memory::ArenaAllocator,_RealCount> *this,
          SListBase<ThunkBlock,_Memory::ArenaAllocator,_RealCount> *list)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  SListBase<ThunkBlock,_Memory::ArenaAllocator,_RealCount> *pSVar4;
  
  pSVar4 = (SListBase<ThunkBlock,_Memory::ArenaAllocator,_RealCount> *)
           (this->super_SListNodeBase<Memory::ArenaAllocator>).next;
  if (pSVar4 == this) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                       ,0x1ba,"(!this->Empty())","!this->Empty()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    pSVar4 = (SListBase<ThunkBlock,_Memory::ArenaAllocator,_RealCount> *)
             (this->super_SListNodeBase<Memory::ArenaAllocator>).next;
  }
  (this->super_SListNodeBase<Memory::ArenaAllocator>).next =
       (pSVar4->super_SListNodeBase<Memory::ArenaAllocator>).next;
  (pSVar4->super_SListNodeBase<Memory::ArenaAllocator>).next =
       (list->super_SListNodeBase<Memory::ArenaAllocator>).next;
  (list->super_SListNodeBase<Memory::ArenaAllocator>).next =
       &pSVar4->super_SListNodeBase<Memory::ArenaAllocator>;
  (list->super_RealCount).count = (list->super_RealCount).count + 1;
  (this->super_RealCount).count = (this->super_RealCount).count - 1;
  return;
}

Assistant:

void MoveHeadTo(SListBase * list)
    {
        Assert(!this->Empty());
        NodeBase * node = this->Next();
        this->Next() = node->Next();
        node->Next() = list->Next();
        list->Next() = node;

        list->IncrementCount();
        this->DecrementCount();
    }